

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O2

bool __thiscall
Jinx::Impl::Parser::CheckFunctionSignature
          (Parser *this,SymbolListCItr currSym,FunctionSignature *signature,size_t *symCount)

{
  pointer pFVar1;
  Symbol *pSVar2;
  pointer pbVar3;
  bool bVar4;
  bool bVar5;
  long lVar6;
  SymbolType SVar7;
  basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *name;
  pointer __lhs;
  FunctionSignaturePart *part;
  pointer pFVar8;
  SymbolListCItr currSym_00;
  
  if (symCount != (size_t *)0x0) {
    *symCount = 0;
  }
  pFVar1 = (signature->m_parts).
           super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar6 = 0;
  for (pFVar8 = (signature->m_parts).
                super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
                ._M_impl.super__Vector_impl_data._M_start; pFVar8 != pFVar1; pFVar8 = pFVar8 + 1) {
    bVar5 = true;
    if (((this->m_error != false) ||
        (pSVar2 = (this->m_symbolList->
                  super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
                  _M_impl.super__Vector_impl_data._M_finish, pSVar2 == currSym._M_current)) ||
       ((currSym._M_current)->type == NewLine)) goto LAB_001ce2f3;
    if (pFVar8->partType == Parameter) {
      if ((((currSym._M_current)->type != CurlyOpen) ||
          (currSym_00._M_current = currSym._M_current + 1, pSVar2 == currSym_00._M_current)) ||
         (SVar7 = (currSym_00._M_current)->type, SVar7 == NewLine)) goto LAB_001ce2f3;
      bVar4 = CheckValueType(this,currSym_00);
      if (bVar4) {
        currSym_00._M_current = currSym._M_current + 2;
        if ((pSVar2 == currSym_00._M_current) ||
           (SVar7 = (currSym_00._M_current)->type, SVar7 == NewLine)) goto LAB_001ce2f3;
        lVar6 = lVar6 + 2;
      }
      else {
        lVar6 = lVar6 + 1;
      }
      currSym._M_current = currSym_00._M_current;
      if (SVar7 != CurlyClose) goto LAB_001ce2f3;
    }
    else {
      __lhs = (pFVar8->names).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
              ._M_impl.super__Vector_impl_data._M_start;
      pbVar3 = (pFVar8->names).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      do {
        if (__lhs == pbVar3) {
          if (pFVar8->optional != true) goto LAB_001ce2d2;
          break;
        }
        bVar5 = std::operator==(__lhs,&(currSym._M_current)->text);
        __lhs = __lhs + 1;
      } while (!bVar5);
    }
    currSym._M_current = currSym._M_current + 1;
    lVar6 = lVar6 + 1;
  }
LAB_001ce2d2:
  bVar5 = pFVar8 != pFVar1;
  if (symCount != (size_t *)0x0 && pFVar8 == pFVar1) {
    *symCount = *symCount + lVar6;
    bVar5 = false;
  }
LAB_001ce2f3:
  return (bool)(bVar5 ^ 1);
}

Assistant:

inline_t bool Parser::CheckFunctionSignature(SymbolListCItr currSym, const FunctionSignature & signature, size_t * symCount) const
	{
		size_t count = 0;
		if (symCount)
			*symCount = 0;
		for (const auto & part : signature.GetParts())
		{
			if (!IsSymbolValid(currSym))
				return false;
			if (part.partType == FunctionSignaturePartType::Parameter)
			{
				if (currSym->type != SymbolType::CurlyOpen)
					return false;
				++currSym;
				++count;
				if (!IsSymbolValid(currSym))
					return false;
				if (CheckValueType(currSym))
				{
					++currSym;
					++count;
					if (!IsSymbolValid(currSym))
						return false;
				}
				if (currSym->type != SymbolType::CurlyClose)
					return false;
			}
			else
			{
				bool matched = false;
				for (const auto & name : part.names)
				{
					if (name == currSym->text)
					{
						matched = true;
						break;
					}
				}
				if (!matched && !part.optional)
					return false;
			}
			++currSym;
			++count;
		}
		if (symCount)
			*symCount += count;
		return true;
	}